

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

void embree::avx::DiscMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar7;
  uint uVar8;
  undefined4 uVar9;
  RTCRayN *pRVar10;
  long lVar12;
  Scene *pSVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar19;
  float fVar20;
  undefined1 auVar17 [16];
  float fVar21;
  undefined1 auVar18 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  float fVar41;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar52 [64];
  vbool<4> valid;
  undefined1 local_1b8 [16];
  RayQueryContext *local_1a8;
  Scene *local_1a0;
  RTCFilterFunctionNArguments args;
  undefined1 local_138 [32];
  undefined1 local_118 [16];
  float local_108 [4];
  float local_f8 [4];
  float local_e8 [4];
  undefined1 local_d8 [16];
  RTCHitN local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  ulong uVar11;
  undefined1 auVar34 [64];
  undefined1 auVar51 [64];
  
  pSVar13 = context->scene;
  pGVar5 = (pSVar13->geometries).items[Disc->sharedGeomID].ptr;
  lVar12 = *(long *)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar14 = *(undefined1 (*) [16])(lVar12 + (Disc->primIDs).field_0.i[0] * _Var6);
  auVar38 = *(undefined1 (*) [16])(lVar12 + (Disc->primIDs).field_0.i[1] * _Var6);
  auVar31 = *(undefined1 (*) [16])(lVar12 + (Disc->primIDs).field_0.i[2] * _Var6);
  auVar30 = *(undefined1 (*) [16])(lVar12 + (Disc->primIDs).field_0.i[3] * _Var6);
  auVar15 = vunpcklps_avx(auVar14,auVar31);
  auVar18 = vunpckhps_avx(auVar14,auVar31);
  auVar14 = vunpcklps_avx(auVar38,auVar30);
  auVar39 = vunpckhps_avx(auVar38,auVar30);
  auVar30 = vunpcklps_avx(auVar15,auVar14);
  auVar38 = vunpckhps_avx(auVar15,auVar14);
  auVar32 = vunpcklps_avx(auVar18,auVar39);
  auVar14 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar31 = vpcmpgtd_avx(auVar14,_DAT_01f4ad30);
  local_d8 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar9 = *(undefined4 *)(ray + k * 4);
  auVar17._4_4_ = uVar9;
  auVar17._0_4_ = uVar9;
  auVar17._8_4_ = uVar9;
  auVar17._12_4_ = uVar9;
  auVar30 = vsubps_avx(auVar30,auVar17);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar15._4_4_ = uVar9;
  auVar15._0_4_ = uVar9;
  auVar15._8_4_ = uVar9;
  auVar15._12_4_ = uVar9;
  auVar15 = vsubps_avx(auVar38,auVar15);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar14._4_4_ = uVar9;
  auVar14._0_4_ = uVar9;
  auVar14._8_4_ = uVar9;
  auVar14._12_4_ = uVar9;
  auVar32 = vsubps_avx(auVar32,auVar14);
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar14 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar38 = vshufps_avx(auVar14,auVar14,0);
  auVar14 = vrcpps_avx(auVar38);
  fVar41 = auVar14._0_4_;
  auVar37._0_4_ = fVar41 * auVar38._0_4_;
  fVar45 = auVar14._4_4_;
  auVar37._4_4_ = fVar45 * auVar38._4_4_;
  fVar46 = auVar14._8_4_;
  auVar37._8_4_ = fVar46 * auVar38._8_4_;
  fVar47 = auVar14._12_4_;
  auVar37._12_4_ = fVar47 * auVar38._12_4_;
  auVar48._8_4_ = 0x3f800000;
  auVar48._0_8_ = 0x3f8000003f800000;
  auVar48._12_4_ = 0x3f800000;
  auVar14 = vsubps_avx(auVar48,auVar37);
  fVar26 = auVar32._0_4_;
  fVar27 = auVar32._4_4_;
  fVar28 = auVar32._8_4_;
  fVar29 = auVar32._12_4_;
  fVar22 = auVar15._0_4_;
  fVar23 = auVar15._4_4_;
  fVar24 = auVar15._8_4_;
  fVar25 = auVar15._12_4_;
  fVar16 = auVar30._0_4_;
  fVar19 = auVar30._4_4_;
  fVar20 = auVar30._8_4_;
  fVar21 = auVar30._12_4_;
  local_118._0_4_ =
       (fVar16 * fVar1 + fVar22 * fVar2 + fVar26 * fVar3) * (fVar41 + fVar41 * auVar14._0_4_);
  local_118._4_4_ =
       (fVar19 * fVar1 + fVar23 * fVar2 + fVar27 * fVar3) * (fVar45 + fVar45 * auVar14._4_4_);
  local_118._8_4_ =
       (fVar20 * fVar1 + fVar24 * fVar2 + fVar28 * fVar3) * (fVar46 + fVar46 * auVar14._8_4_);
  local_118._12_4_ =
       (fVar21 * fVar1 + fVar25 * fVar2 + fVar29 * fVar3) * (fVar47 + fVar47 * auVar14._12_4_);
  auVar49 = ZEXT1664(local_118);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar38._4_4_ = uVar9;
  auVar38._0_4_ = uVar9;
  auVar38._8_4_ = uVar9;
  auVar38._12_4_ = uVar9;
  auVar14 = vcmpps_avx(auVar38,local_118,2);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar50._4_4_ = uVar9;
  auVar50._0_4_ = uVar9;
  auVar50._8_4_ = uVar9;
  auVar50._12_4_ = uVar9;
  auVar51 = ZEXT1664(auVar50);
  auVar38 = vcmpps_avx(local_118,auVar50,2);
  auVar14 = vandps_avx(auVar38,auVar14);
  auVar38 = auVar31 & auVar14;
  if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar38[0xf] < '\0') {
    auVar14 = vandps_avx(auVar14,auVar31);
    auVar18 = vunpckhps_avx(auVar18,auVar39);
    auVar31._0_4_ = local_118._0_4_ * fVar1;
    auVar31._4_4_ = local_118._4_4_ * fVar1;
    auVar31._8_4_ = local_118._8_4_ * fVar1;
    auVar31._12_4_ = local_118._12_4_ * fVar1;
    auVar39._0_4_ = local_118._0_4_ * fVar2;
    auVar39._4_4_ = local_118._4_4_ * fVar2;
    auVar39._8_4_ = local_118._8_4_ * fVar2;
    auVar39._12_4_ = local_118._12_4_ * fVar2;
    auVar42._0_4_ = local_118._0_4_ * fVar3;
    auVar42._4_4_ = local_118._4_4_ * fVar3;
    auVar42._8_4_ = local_118._8_4_ * fVar3;
    auVar42._12_4_ = local_118._12_4_ * fVar3;
    auVar38 = vsubps_avx(auVar30,auVar31);
    auVar31 = vsubps_avx(auVar15,auVar39);
    auVar30 = vsubps_avx(auVar32,auVar42);
    auVar43._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar43._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar43._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar43._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    auVar32._0_4_ = auVar31._0_4_ * auVar31._0_4_ + auVar43._0_4_ + auVar38._0_4_ * auVar38._0_4_;
    auVar32._4_4_ = auVar31._4_4_ * auVar31._4_4_ + auVar43._4_4_ + auVar38._4_4_ * auVar38._4_4_;
    auVar32._8_4_ = auVar31._8_4_ * auVar31._8_4_ + auVar43._8_4_ + auVar38._8_4_ * auVar38._8_4_;
    auVar32._12_4_ =
         auVar31._12_4_ * auVar31._12_4_ + auVar43._12_4_ + auVar38._12_4_ * auVar38._12_4_;
    auVar30._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar30._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar30._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar30._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar38 = vcmpps_avx(auVar32,auVar30,2);
    auVar31 = auVar14 & auVar38;
    if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0')
    {
      auVar38 = vandps_avx(auVar14,auVar38);
      auVar18._0_4_ = fVar16 * fVar16 + fVar22 * fVar22 + fVar26 * fVar26;
      auVar18._4_4_ = fVar19 * fVar19 + fVar23 * fVar23 + fVar27 * fVar27;
      auVar18._8_4_ = fVar20 * fVar20 + fVar24 * fVar24 + fVar28 * fVar28;
      auVar18._12_4_ = fVar21 * fVar21 + fVar25 * fVar25 + fVar29 * fVar29;
      auVar31 = vcmpps_avx(auVar18,auVar30,6);
      auVar30 = auVar31 & auVar38;
      if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar30[0xf] < '\0'
         ) {
        valid.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar38,auVar31);
        local_138 = ZEXT1632(ZEXT816(0));
        local_108[0] = -fVar1;
        local_108[1] = -fVar1;
        local_108[2] = -fVar1;
        local_108[3] = -fVar1;
        local_f8[0] = -fVar2;
        local_f8[1] = -fVar2;
        local_f8[2] = -fVar2;
        local_f8[3] = -fVar2;
        local_e8[0] = -fVar3;
        local_e8[1] = -fVar3;
        local_e8[2] = -fVar3;
        local_e8[3] = -fVar3;
        auVar33._8_4_ = 0x7f800000;
        auVar33._0_8_ = 0x7f8000007f800000;
        auVar33._12_4_ = 0x7f800000;
        auVar34 = ZEXT1664(auVar33);
        auVar38 = vblendvps_avx(auVar33,local_118,(undefined1  [16])valid.field_0);
        auVar31 = vshufps_avx(auVar38,auVar38,0xb1);
        auVar31 = vminps_avx(auVar31,auVar38);
        auVar30 = vshufpd_avx(auVar31,auVar31,1);
        auVar31 = vminps_avx(auVar30,auVar31);
        auVar38 = vcmpps_avx(auVar38,auVar31,0);
        auVar31 = (undefined1  [16])valid.field_0 & auVar38;
        aVar7 = valid.field_0;
        if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar31[0xf] < '\0') {
          aVar7 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                  vandps_avx(auVar38,(undefined1  [16])valid.field_0);
        }
        uVar8 = vmovmskps_avx((undefined1  [16])aVar7);
        lVar12 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        auVar35 = vcmpps_avx(ZEXT1632(auVar14),ZEXT1632(auVar14),0xf);
        auVar36 = ZEXT3264(auVar35);
        auVar40 = ZEXT464(0) << 0x20;
        auVar14 = vpcmpeqd_avx(auVar43,auVar43);
        auVar44 = ZEXT1664(auVar14);
        auVar52 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
        do {
          args.hit = local_c8;
          args.valid = (int *)local_1b8;
          uVar8 = *(uint *)(local_d8 + lVar12 * 4);
          pRVar10 = (RTCRayN *)(ulong)uVar8;
          pGVar5 = (pSVar13->geometries).items[(long)pRVar10].ptr;
          if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_1b8 + lVar12 * 4 + -0x10) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar9 = *(undefined4 *)(local_138 + lVar12 * 4);
              uVar4 = *(undefined4 *)(local_138 + lVar12 * 4 + 0x10);
              *(float *)(ray + k * 4 + 0x80) = local_108[lVar12 + -4];
              *(float *)(ray + k * 4 + 0xc0) = local_108[lVar12];
              *(float *)(ray + k * 4 + 0xd0) = local_f8[lVar12];
              *(float *)(ray + k * 4 + 0xe0) = local_e8[lVar12];
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar9;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
              *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar12];
              *(uint *)(ray + k * 4 + 0x120) = uVar8;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              return;
            }
            local_98 = *(undefined4 *)(local_138 + lVar12 * 4);
            local_88 = *(undefined4 *)(local_138 + lVar12 * 4 + 0x10);
            local_68 = vpshufd_avx(ZEXT416(uVar8),0);
            local_78 = (Disc->primIDs).field_0.i[lVar12];
            fVar1 = local_108[lVar12];
            fVar2 = local_f8[lVar12];
            local_b8._4_4_ = fVar2;
            local_b8._0_4_ = fVar2;
            local_b8._8_4_ = fVar2;
            local_b8._12_4_ = fVar2;
            fVar2 = local_e8[lVar12];
            local_a8._4_4_ = fVar2;
            local_a8._0_4_ = fVar2;
            local_a8._8_4_ = fVar2;
            local_a8._12_4_ = fVar2;
            local_c8[0] = (RTCHitN)SUB41(fVar1,0);
            local_c8[1] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_c8[2] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_c8[3] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_c8[4] = (RTCHitN)SUB41(fVar1,0);
            local_c8[5] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_c8[6] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_c8[7] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_c8[8] = (RTCHitN)SUB41(fVar1,0);
            local_c8[9] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_c8[10] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_c8[0xb] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_c8[0xc] = (RTCHitN)SUB41(fVar1,0);
            local_c8[0xd] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_c8[0xe] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_c8[0xf] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            uStack_94 = local_98;
            uStack_90 = local_98;
            uStack_8c = local_98;
            uStack_84 = local_88;
            uStack_80 = local_88;
            uStack_7c = local_88;
            uStack_74 = local_78;
            uStack_70 = local_78;
            uStack_6c = local_78;
            uStack_54 = context->user->instID[0];
            local_58 = uStack_54;
            uStack_50 = uStack_54;
            uStack_4c = uStack_54;
            uStack_48 = context->user->instPrimID[0];
            uStack_44 = uStack_48;
            uStack_40 = uStack_48;
            uStack_3c = uStack_48;
            *(float *)(ray + k * 4 + 0x80) = local_108[lVar12 + -4];
            local_1b8 = *(undefined1 (*) [16])
                         (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
            args.geometryUserPtr = pGVar5->userPtr;
            args.context = context->user;
            args.N = 4;
            pRVar10 = (RTCRayN *)pGVar5->intersectionFilterN;
            auVar14 = auVar49._0_16_;
            auVar38 = auVar51._0_16_;
            auVar31 = auVar52._0_16_;
            local_1a8 = context;
            args.ray = (RTCRayN *)ray;
            if (pRVar10 != (RTCRayN *)0x0) {
              auVar35 = ZEXT1632(auVar36._0_16_);
              auVar30 = auVar44._0_16_;
              local_1a0 = pSVar13;
              pRVar10 = (RTCRayN *)(*(code *)pRVar10)(&args);
              auVar52 = ZEXT1664(auVar31);
              auVar30 = vpcmpeqd_avx(auVar30,auVar30);
              auVar44 = ZEXT1664(auVar30);
              auVar40 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar35 = vcmpps_avx(auVar35,auVar35,0xf);
              auVar36 = ZEXT3264(auVar35);
              auVar34 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar51 = ZEXT1664(auVar38);
              auVar49 = ZEXT1664(auVar14);
              pSVar13 = local_1a0;
            }
            auVar30 = auVar44._0_16_;
            if (local_1b8 == (undefined1  [16])0x0) {
              auVar14 = vpcmpeqd_avx(auVar40._0_16_,(undefined1  [16])0x0);
              auVar30 = auVar30 ^ auVar14;
              context = local_1a8;
            }
            else {
              pRVar10 = (RTCRayN *)local_1a8->args->filter;
              if ((pRVar10 != (RTCRayN *)0x0) &&
                 (((local_1a8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                auVar35 = ZEXT1632(auVar36._0_16_);
                pRVar10 = (RTCRayN *)(*(code *)pRVar10)();
                auVar52 = ZEXT1664(auVar31);
                auVar31 = vpcmpeqd_avx(auVar30,auVar30);
                auVar44 = ZEXT1664(auVar31);
                auVar40 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar35 = vcmpps_avx(auVar35,auVar35,0xf);
                auVar36 = ZEXT3264(auVar35);
                auVar34 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar51 = ZEXT1664(auVar38);
                auVar49 = ZEXT1664(auVar14);
              }
              auVar14 = vpcmpeqd_avx(auVar40._0_16_,local_1b8);
              auVar30 = auVar44._0_16_ ^ auVar14;
              context = local_1a8;
              if (local_1b8 != (undefined1  [16])0x0) {
                auVar14 = auVar44._0_16_ ^ auVar14;
                auVar38 = vmaskmovps_avx(auVar14,*(undefined1 (*) [16])args.hit);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar38;
                auVar38 = vmaskmovps_avx(auVar14,*(undefined1 (*) [16])(args.hit + 0x10));
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar38;
                auVar38 = vmaskmovps_avx(auVar14,*(undefined1 (*) [16])(args.hit + 0x20));
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar38;
                auVar38 = vmaskmovps_avx(auVar14,*(undefined1 (*) [16])(args.hit + 0x30));
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar38;
                auVar38 = vmaskmovps_avx(auVar14,*(undefined1 (*) [16])(args.hit + 0x40));
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar38;
                auVar38 = vmaskmovps_avx(auVar14,*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar38;
                auVar38 = vmaskmovps_avx(auVar14,*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar38;
                auVar38 = vmaskmovps_avx(auVar14,*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar38;
                auVar14 = vmaskmovps_avx(auVar14,*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar14;
                pRVar10 = args.ray;
              }
            }
            if ((auVar52._0_16_ & auVar30) == (undefined1  [16])0x0) {
              *(int *)(ray + k * 4 + 0x80) = auVar51._0_4_;
            }
            else {
              auVar51 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_1b8 + lVar12 * 4 + -0x10) = 0;
            auVar14 = vshufps_avx(auVar51._0_16_,auVar51._0_16_,0);
            auVar14 = vcmpps_avx(auVar49._0_16_,auVar14,2);
            valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                 vandps_avx(auVar14,(undefined1  [16])valid.field_0);
          }
          if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0 &&
               ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
               (undefined1  [16])0x0) &&
              ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) {
            return;
          }
          auVar14 = vblendvps_avx(auVar34._0_16_,auVar49._0_16_,(undefined1  [16])valid.field_0);
          auVar38 = vshufps_avx(auVar14,auVar14,0xb1);
          auVar38 = vminps_avx(auVar38,auVar14);
          auVar31 = vshufpd_avx(auVar38,auVar38,1);
          auVar38 = vminps_avx(auVar31,auVar38);
          auVar14 = vcmpps_avx(auVar14,auVar38,0);
          auVar38 = (undefined1  [16])valid.field_0 & auVar14;
          aVar7 = valid.field_0;
          if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar38[0xf] < '\0') {
            aVar7.v = (__m128)vandps_avx(auVar14,valid.field_0);
          }
          uVar9 = vmovmskps_avx((undefined1  [16])aVar7);
          uVar11 = CONCAT44((int)((ulong)pRVar10 >> 0x20),uVar9);
          lVar12 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }